

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O0

void __thiscall jsonip::writer<false>::new_double(writer<false> *this,double d)

{
  double d_local;
  writer<false> *this_local;
  
  pre(this);
  std::ostream::operator<<(this->os,d);
  this->comma = true;
  return;
}

Assistant:

void new_double(double d)
        {
            pre();
            os << d;
            comma = true;
        }